

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall
CcsTest_DomainBuilderNestedSelect_Test::CcsTest_DomainBuilderNestedSelect_Test
          (CcsTest_DomainBuilderNestedSelect_Test *this)

{
  CcsTest_DomainBuilderNestedSelect_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__CcsTest_DomainBuilderNestedSelect_Test_00264da0;
  return;
}

Assistant:

TEST(CcsTest, DomainBuilderNestedSelect) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("a", "base")
      .select("a", v("b"))
        .select("c", v("d"))
          .set("a", "123");
  CcsContext ctx = ccs.build();
  EXPECT_EQ("base", ctx.getString("a"));
  EXPECT_EQ("base", ctx.constrain("a", v("b")).getString("a"));
  EXPECT_EQ("base", ctx.constrain("c", v("d")).getString("a"));
  EXPECT_EQ("123", ctx.constrain("a", v("b")).constrain("c", v("d"))
          .getString("a"));
}